

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O3

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuEvent> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  QDBusMenuEvent item;
  undefined1 *local_88;
  QArrayData *pQStack_80;
  char16_t *local_78;
  qsizetype qStack_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 uStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuEvent>::clear(list);
  cVar1 = QDBusArgument::atEnd();
  if (cVar1 == '\0') {
    do {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = 0;
      local_68._16_8_ = 0;
      qStack_70 = 0;
      local_68.shared = (PrivateShared *)0x0;
      pQStack_80 = (QArrayData *)0x0;
      local_78 = (char16_t *)0x0;
      uStack_50 = 2;
      operator>>(arg,(QDBusMenuEvent *)&local_88);
      QtPrivate::QMovableArrayOps<QDBusMenuEvent>::emplace<QDBusMenuEvent_const&>
                ((QMovableArrayOps<QDBusMenuEvent> *)list,(list->d).size,(QDBusMenuEvent *)&local_88
                );
      QList<QDBusMenuEvent>::end(list);
      QVariant::~QVariant((QVariant *)&local_68);
      if (pQStack_80 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_80->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_80,2,0x10);
        }
      }
      cVar1 = QDBusArgument::atEnd();
    } while (cVar1 == '\0');
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}